

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Matchers::StdString::StringMatcherBase::StringMatcherBase
          (StringMatcherBase *this,string *operation,CasedString *comparator)

{
  pointer pcVar1;
  
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(this->
                 super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).super_MatcherUntypedBase.m_cachedToString.field_2;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_MatcherUntypedBase.m_cachedToString._M_string_length = 0;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_MatcherUntypedBase.m_cachedToString.field_2._M_local_buf[0] = '\0';
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__StringMatcherBase_0019b150;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherMethod = (_func_int **)&DAT_0019b178;
  (this->m_comparator).m_caseSensitivity = comparator->m_caseSensitivity;
  (this->m_comparator).m_str._M_dataplus._M_p = (pointer)&(this->m_comparator).m_str.field_2;
  pcVar1 = (comparator->m_str)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_comparator).m_str,pcVar1,
             pcVar1 + (comparator->m_str)._M_string_length);
  (this->m_operation)._M_dataplus._M_p = (pointer)&(this->m_operation).field_2;
  pcVar1 = (operation->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_operation,pcVar1,pcVar1 + operation->_M_string_length);
  return;
}

Assistant:

StringMatcherBase::StringMatcherBase( std::string const& operation, CasedString const& comparator )
        : m_comparator( comparator ),
          m_operation( operation ) {
        }